

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

pair<tyti::stl::basic_solid<double>,_bool> *
tyti::stl::read<double>
          (pair<tyti::stl::basic_solid<double>,_bool> *__return_storage_ptr__,string *fileName)

{
  bool local_81;
  undefined1 local_80 [7];
  bool r;
  basic_solid<double> out;
  string *fileName_local;
  
  out.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)fileName;
  basic_solid<double>::basic_solid((basic_solid<double> *)local_80);
  local_81 = read<double>((basic_solid<double> *)local_80,
                          (string *)
                          out.attributes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::make_pair<tyti::stl::basic_solid<double>,bool>
            (__return_storage_ptr__,(basic_solid<double> *)local_80,&local_81);
  basic_solid<double>::~basic_solid((basic_solid<double> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<basic_solid<T>, bool> read(const std::string& fileName)
        {
            basic_solid<T> out;
            bool r = read(out, fileName);
            return std::make_pair<basic_solid<T>, bool>(std::move(out), std::move(r));
        }